

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

void * __thiscall
lossless_neural_sound::expression_compiler::Arena::
allocate<lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>>
          (Arena *this)

{
  ulong uVar1;
  _Elt_pointer pMVar2;
  ulong uVar3;
  
  pMVar2 = (this->memory_blocks).
           super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pMVar2 != (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (pMVar2 == (this->memory_blocks).
                  super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pMVar2 = (this->memory_blocks).
               super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
    }
    uVar1 = pMVar2[-1].used + 7 & 0xfffffffffffffff8;
    uVar3 = uVar1 + 0x50;
    if (uVar3 < 0x1001) goto LAB_001219fa;
  }
  std::
  deque<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
  ::emplace_back<>(&this->memory_blocks);
  pMVar2 = (this->memory_blocks).
           super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pMVar2 == (this->memory_blocks).
                super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pMVar2 = (this->memory_blocks).
             super__Deque_base<lossless_neural_sound::expression_compiler::Arena::Memory_block,_std::allocator<lossless_neural_sound::expression_compiler::Arena::Memory_block>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 1;
  }
  uVar1 = pMVar2[-1].used + 7 & 0xfffffffffffffff8;
  uVar3 = uVar1 + 0x50;
  if (0x1000 < uVar3) {
    __assert_fail("retval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/arena.h"
                  ,0x6f,
                  "void *lossless_neural_sound::expression_compiler::Arena::allocate() [T = lossless_neural_sound::expression_compiler::Arena::Node<lossless_neural_sound::expression_compiler::expression::Sum>]"
                 );
  }
LAB_001219fa:
  pMVar2[-1].used = uVar3;
  return pMVar2[-1].bytes + uVar1;
}

Assistant:

void *allocate()
    {
        static_assert(alignof(T) <= memory_block_alignment, "");
        static_assert(is_nonzero_power_of_2(alignof(T)), "");
        assert(sizeof(T) < big_memory_block_start_size);
        void *retval = memory_blocks.empty() ?
                           nullptr :
                           memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        if(!retval)
        {
            memory_blocks.emplace_back();
            retval = memory_blocks.back().allocate<sizeof(T), alignof(T)>();
        }
        assert(retval);
        return retval;
    }